

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

GdlExpression * __thiscall
GdlStringExpression::ConvertFeatureSettingValue
          (GdlStringExpression *this,GdlFeatureDefn *pfeat,bool *fErr)

{
  ulong uVar1;
  pointer pcVar2;
  GdlExpression *pGVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (pfeat->m_fStdLang != true) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Inappropriate value of feature setting: ","");
    pcVar2 = (this->m_staValue)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (this->m_staValue)._M_string_length);
    GrcErrorList::AddItem
              (&g_errorList,true,0x844,
               &(this->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject,
               (GrpLineAndFile *)0x0,&local_b0,&local_90,(string *)0x0,(string *)0x0,(string *)0x0,
               (string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    *fErr = true;
    return (GdlExpression *)this;
  }
  uVar1 = (this->m_staValue)._M_string_length;
  if (uVar1 < 5) {
    if (uVar1 != 4) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Possibly invalid language ID--4-byte string expected","");
      GrcErrorList::AddWarning
                (&g_errorList,0x9d8,
                 &(this->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001500a5;
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Invalid language ID--must be a 4-byte string","");
    GrcErrorList::AddError
              (&g_errorList,0x843,
               &(this->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    *fErr = true;
LAB_001500a5:
    if (uVar1 == 0) {
      uVar4 = 0;
      goto LAB_001500b8;
    }
  }
  uVar4 = (uint)(byte)*(this->m_staValue)._M_dataplus._M_p << 0x18;
LAB_001500b8:
  uVar6 = 0;
  uVar7 = 0;
  if (1 < uVar1) {
    uVar7 = (uint)(byte)(this->m_staValue)._M_dataplus._M_p[1] << 0x10;
  }
  if (2 < uVar1) {
    uVar6 = (uint)(byte)(this->m_staValue)._M_dataplus._M_p[2] << 8;
  }
  uVar5 = 0;
  if (3 < uVar1) {
    uVar5 = (uint)(byte)(this->m_staValue)._M_dataplus._M_p[3];
  }
  pGVar3 = (GdlExpression *)operator_new(0x40);
  GdlObject::GdlObject(&pGVar3->super_GdlObject);
  pGVar3->_vptr_GdlExpression = (_func_int **)&PTR_Clone_00241fc8;
  *(uint *)&pGVar3->field_0x34 = uVar6 | uVar5 | uVar7 | uVar4;
  *(undefined4 *)&pGVar3[1]._vptr_GdlExpression = 0xffffffff;
  *(undefined1 *)((long)&pGVar3[1]._vptr_GdlExpression + 4) = 0;
  pGVar3->m_exptResult = kexptNumber;
  return pGVar3;
}

Assistant:

GdlExpression * GdlStringExpression::ConvertFeatureSettingValue(GdlFeatureDefn * pfeat, bool & fErr)
{
	if (pfeat->IsLanguageFeature())
	{
		int nValue = 0;
		auto cb = m_staValue.length();
		if (m_staValue.length() > 4)
		{
			g_errorList.AddError(2115, this,
				"Invalid language ID--must be a 4-byte string");
			fErr = true;
		}
		else if (m_staValue.length() < 4)
		{
			g_errorList.AddWarning(2520, this,
				"Possibly invalid language ID--4-byte string expected");
		}
		gr::byte b1, b2, b3, b4;
		b1 = (cb > 0) ? m_staValue[0] : 0;
		b2 = (cb > 1) ? m_staValue[1] : 0;
		b3 = (cb > 2) ? m_staValue[2] : 0;
		b4 = (cb > 3) ? m_staValue[3] : 0;
		nValue = (b1 << 24) | (b2 << 16) | (b3 << 8) | b4;

		//	Caller will replace original expression with numeric value.
		GdlNumericExpression * pexpValue = new GdlNumericExpression(nValue);
		return pexpValue;
	}
	else
	{
		g_errorList.AddError(2116, this,
			"Inappropriate value of feature setting: ",
			m_staValue);
		fErr = true;
	}
	return this;
}